

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectType *pxVar1;
  xmlXPathObjectType xVar2;
  uint uVar3;
  int iVar4;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  xmlXPathObjectPtr arg2_00;
  
  uVar3 = 0;
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if (arg2 == (xmlXPathObjectPtr)0x0 || arg1 == (xmlXPathObjectPtr)0x0) {
      if (arg1 != (xmlXPathObjectPtr)0x0) {
        arg2 = arg1;
      }
      xmlXPathReleaseObject(ctxt->context,arg2);
      xmlXPathErr(ctxt,10);
    }
    else {
      arg2_00 = arg1;
      uVar3 = 0;
      if (arg1 != arg2) {
        pxVar1 = &arg2->type;
        if ((*pxVar1 | XPATH_USERS) == XPATH_XSLT_TREE) {
          xVar2 = arg1->type;
        }
        else {
          xVar2 = arg1->type;
          if ((xVar2 | XPATH_USERS) != XPATH_XSLT_TREE) {
            iVar4 = xmlXPathEqualValuesCommon(ctxt,arg1,arg2);
            return (uint)(iVar4 == 0);
          }
        }
        if ((xVar2 | XPATH_USERS) == XPATH_XSLT_TREE) {
          arg2_00 = arg2;
          arg2 = arg1;
          xVar2 = *pxVar1;
        }
        uVar3 = 0;
        switch(xVar2) {
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
          uVar3 = xmlXPathEqualNodeSets(ctxt,arg2,arg2_00,1);
          break;
        case XPATH_BOOLEAN:
          uVar3 = 0;
          if (arg2->nodesetval != (xmlNodeSetPtr)0x0) {
            uVar3 = (uint)(arg2->nodesetval->nodeNr != 0);
          }
          uVar3 = (uint)(uVar3 != arg2_00->boolval);
          break;
        case XPATH_NUMBER:
          uVar3 = xmlXPathEqualNodeSetFloat(ctxt,arg2,arg2_00->floatval,1);
          break;
        case XPATH_STRING:
          uVar3 = xmlXPathEqualNodeSetString(ctxt,arg2,arg2_00->stringval,1);
        }
        xmlXPathReleaseObject(ctxt->context,arg2);
      }
      xmlXPathReleaseObject(ctxt->context,arg2_00);
    }
  }
  return uVar3;
}

Assistant:

int
xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg1, arg2, argtmp;
    int ret = 0;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if (arg1 == arg2) {
	xmlXPathReleaseObject(ctxt->context, arg1);
        return(0);
    }

    /*
     *If either argument is a nodeset, it's a 'special case'
     */
    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 *Hack it to assure arg1 is the nodeset
	 */
	if ((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE)) {
		argtmp = arg2;
		arg2 = arg1;
		arg1 = argtmp;
	}
	switch (arg2->type) {
	    case XPATH_UNDEFINED:
		break;
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		ret = xmlXPathEqualNodeSets(ctxt, arg1, arg2, 1);
		break;
	    case XPATH_BOOLEAN:
		if ((arg1->nodesetval == NULL) ||
		  (arg1->nodesetval->nodeNr == 0)) ret = 0;
		else
		    ret = 1;
		ret = (ret != arg2->boolval);
		break;
	    case XPATH_NUMBER:
		ret = xmlXPathEqualNodeSetFloat(ctxt, arg1, arg2->floatval, 1);
		break;
	    case XPATH_STRING:
		ret = xmlXPathEqualNodeSetString(ctxt, arg1,
                                                 arg2->stringval, 1);
		break;
	    case XPATH_USERS:
		/* TODO */
		break;
	}
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	return(ret);
    }

    return (!xmlXPathEqualValuesCommon(ctxt, arg1, arg2));
}